

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O3

void server::rename_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint cn;
  int iVar2;
  clientinfo *pcVar3;
  char *pcVar4;
  vector<unsigned_char> buf;
  char newname [16];
  vector<unsigned_char> local_78;
  packetbuf local_60;
  char local_38 [15];
  undefined1 local_29;
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    cn = atoi(args[1]);
    pcVar4 = args[2];
    pcVar3 = QServ::getClient(&qs,cn);
    if (((pcVar4 != (char *)0x0 && pcVar3 != (clientinfo *)0x0) && (cn < 0x80)) &&
       (*pcVar4 != '\x01')) {
      local_29 = 0;
      filtertext(local_38,pcVar4,false,true,0xf);
      putuint(&pcVar3->messages,0x68);
      sendstring(local_38,&pcVar3->messages);
      local_78.buf = (uchar *)0x0;
      local_78.alen = 0;
      local_78.ulen = 0;
      putuint(&local_78,0x68);
      sendstring(local_38,&local_78);
      local_60.super_ucharbuf.flags = '\0';
      local_60.super_ucharbuf.len = 0;
      local_60.super_ucharbuf.maxlen = 0;
      local_60.growth = 5000;
      local_60.packet = enet_packet_create((void *)0x0,5000,1);
      local_60.super_ucharbuf.buf = (local_60.packet)->data;
      local_60.super_ucharbuf.maxlen = (int)(local_60.packet)->dataLength;
      putuint(&local_60,0x58);
      putint(&local_60,pcVar3->clientnum);
      putint(&local_60,local_78.ulen);
      packetbuf::put(&local_60,local_78.buf,local_78.ulen);
      iVar2 = pcVar3->clientnum;
      enet_packet_resize(local_60.packet,(long)local_60.super_ucharbuf.len);
      local_60.super_ucharbuf.buf = (local_60.packet)->data;
      local_60.super_ucharbuf.maxlen = (int)(local_60.packet)->dataLength;
      sendpacket(iVar2,1,local_60.packet,-1);
      strncpy(pcVar3->name,local_38,0x104);
      pcVar3->name[0x103] = '\0';
      if (((0 < local_60.growth) && (local_60.packet != (ENetPacket *)0x0)) &&
         ((local_60.packet)->referenceCount == 0)) {
        enet_packet_destroy(local_60.packet);
      }
      local_78._8_8_ = local_78._8_8_ & 0xffffffff;
      if (local_78.buf != (uchar *)0x0) {
        operator_delete__(local_78.buf);
      }
    }
    return;
  }
  iVar2 = QServ::getSender(&qs);
  pcVar4 = QServ::getCommandDesc(&qs,cid);
  sendf(iVar2,1,"ris",0x23,pcVar4);
  return;
}

Assistant:

QSERV_CALLBACK rename_cmd(p) {
        if(CMD_SA) {
            int cn = atoi(args[1]);
            char *name = args[2];
            clientinfo *ci = qs.getClient(cn);
            if(!ci || name == NULL || name[0] == 1 || cn < 0 || cn >= 128) return;
            char newname[MAXNAMELEN + 1];
            newname[MAXNAMELEN] = 0;
            filtertext(newname, name, false, MAXNAMELEN);
            putuint(ci->messages, N_SWITCHNAME);
            sendstring(newname, ci->messages);
            vector<uchar> buf;
            putuint(buf, N_SWITCHNAME);
            sendstring(newname, buf);
            packetbuf v(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
            putuint(v, N_CLIENT);
            putint(v, ci->clientnum);
            putint(v, buf.length());
            v.put(buf.getbuf(), buf.length());
            sendpacket(ci->clientnum, 1, v.finalize(), -1);
            string oldname;
            copystring(oldname, ci->name);
            copystring(ci->name, newname);
        }
        else sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }